

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseContent(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  int mode;
  htmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  while( true ) {
    bVar2 = false;
    if (ctxt->disableSAX < 2) {
      bVar2 = ctxt->input->cur < ctxt->input->end;
    }
    if (!bVar2) break;
    if ((ctxt->endCheckState == 0) && (*ctxt->input->cur == '<')) {
      if (ctxt->input->cur[1] == '/') {
        htmlParseEndTag(ctxt);
      }
      else if (ctxt->input->cur[1] == '!') {
        iVar1 = toupper((uint)ctxt->input->cur[2]);
        if ((((iVar1 == 0x44) && (iVar1 = toupper((uint)ctxt->input->cur[3]), iVar1 == 0x4f)) &&
            (iVar1 = toupper((uint)ctxt->input->cur[4]), iVar1 == 0x43)) &&
           (((iVar1 = toupper((uint)ctxt->input->cur[5]), iVar1 == 0x54 &&
             (iVar1 = toupper((uint)ctxt->input->cur[6]), iVar1 == 0x59)) &&
            ((iVar1 = toupper((uint)ctxt->input->cur[7]), iVar1 == 0x50 &&
             (iVar1 = toupper((uint)ctxt->input->cur[8]), iVar1 == 0x45)))))) {
          htmlParseDocTypeDecl(ctxt);
        }
        else if ((ctxt->input->cur[2] == '-') && (ctxt->input->cur[3] == '-')) {
          ctxt->input->cur = ctxt->input->cur + 4;
          ctxt->input->col = ctxt->input->col + 4;
          htmlParseComment(ctxt,0);
        }
        else {
          ctxt->input->cur = ctxt->input->cur + 2;
          ctxt->input->col = ctxt->input->col + 2;
          htmlParseComment(ctxt,1);
        }
      }
      else if (ctxt->input->cur[1] == '?') {
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
        htmlParseComment(ctxt,1);
      }
      else if (((ctxt->input->cur[1] | 0x20) < 0x61) || (0x7a < (ctxt->input->cur[1] | 0x20))) {
        htmlStartCharData(ctxt);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           ((ctxt->disableSAX == 0 && (ctxt->sax->characters != (charactersSAXFunc)0x0)))) {
          (*ctxt->sax->characters)(ctxt->userData,"<",1);
        }
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
      }
      else {
        htmlParseElementInternal(ctxt);
      }
    }
    else {
      htmlParseCharData(ctxt,0);
    }
    if ((((ctxt->input->flags & 0x40U) == 0) &&
        (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlParserShrink(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  }
  if (ctxt->input->end <= ctxt->input->cur) {
    htmlAutoCloseOnEnd(ctxt);
  }
  return;
}

Assistant:

static void
htmlParseContent(htmlParserCtxtPtr ctxt) {
    GROW;

    while ((PARSER_STOPPED(ctxt) == 0) &&
           (ctxt->input->cur < ctxt->input->end)) {
        int mode;

        mode = ctxt->endCheckState;

        if ((mode == 0) && (CUR == '<')) {
            if (NXT(1) == '/') {
	        htmlParseEndTag(ctxt);
            } else if (NXT(1) == '!') {
                /*
                 * Sometimes DOCTYPE arrives in the middle of the document
                 */
                if ((UPP(2) == 'D') && (UPP(3) == 'O') &&
                    (UPP(4) == 'C') && (UPP(5) == 'T') &&
                    (UPP(6) == 'Y') && (UPP(7) == 'P') &&
                    (UPP(8) == 'E')) {
                    htmlParseDocTypeDecl(ctxt);
                } else if ((NXT(2) == '-') && (NXT(3) == '-')) {
                    SKIP(4);
                    htmlParseComment(ctxt, /* bogus */ 0);
                } else {
                    SKIP(2);
                    htmlParseComment(ctxt, /* bogus */ 1);
                }
            } else if (NXT(1) == '?') {
                SKIP(1);
                htmlParseComment(ctxt, /* bogus */ 1);
            } else if (IS_ASCII_LETTER(NXT(1))) {
                htmlParseElementInternal(ctxt);
            } else {
                htmlStartCharData(ctxt);
                if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
                    (ctxt->sax->characters != NULL))
                    ctxt->sax->characters(ctxt->userData, BAD_CAST "<", 1);
                SKIP(1);
            }
        } else {
            htmlParseCharData(ctxt, /* partial */ 0);
        }

        SHRINK;
        GROW;
    }

    if (ctxt->input->cur >= ctxt->input->end)
        htmlAutoCloseOnEnd(ctxt);
}